

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dino_strmap.c
# Opt level: O0

char * dino_strmap_get_value(str_map_t *map,char *key)

{
  unsigned_long uVar1;
  pair_t *ppVar2;
  pair_t *pair;
  bucket_t *bucket;
  uint index;
  char *key_local;
  str_map_t *map_local;
  
  if ((map == (str_map_t *)0x0) || (key == (char *)0x0)) {
    map_local = (str_map_t *)0x10a78b;
  }
  else {
    uVar1 = hash(key);
    ppVar2 = get_pair(map->buckets + uVar1 % (ulong)map->count,key);
    if (ppVar2 == (pair_t *)0x0) {
      map_local = (str_map_t *)0x10a78b;
    }
    else {
      map_local = (str_map_t *)ppVar2->value;
    }
  }
  return (char *)map_local;
}

Assistant:

const char *dino_strmap_get_value(const str_map_t *map, const char *key) {
    if (NULL == map || NULL == key) {
        return "";
    }

    unsigned int index = (unsigned int) (hash(key) % map->count);
    bucket_t *bucket = &(map->buckets[index]);
    pair_t *pair = get_pair(bucket, key);
    if (NULL == pair) {
        return "";
    }

    return pair->value;
}